

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O0

bool Read2D(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *path;
  element_type *peVar4;
  Data *data;
  FILE *__stream;
  bool bVar5;
  allocator<char> local_81;
  undefined1 local_80 [44];
  Format fmt;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  fmt._52_8_ = disk;
  Format::Format((Format *)(local_80 + 0x24),_2D);
  path = MemFile::name_abi_cxx11_(file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"2d",&local_81);
  __stream = (FILE *)local_80;
  bVar1 = IsFileExt(path,(string *)__stream);
  bVar5 = true;
  if (bVar1) {
    iVar2 = MemFile::size(file);
    iVar3 = Format::disk_size((Format *)(local_80 + 0x24));
    bVar5 = iVar2 != iVar3;
  }
  std::__cxx11::string::~string((string *)local_80);
  std::allocator<char>::~allocator(&local_81);
  if (!bVar5) {
    MemFile::rewind(file,__stream);
    peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        fmt._52_8_);
    data = MemFile::data(file);
    Disk::format(peVar4,(Format *)(local_80 + 0x24),data,false);
    peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        fmt._52_8_);
    std::__cxx11::string::operator=((string *)&peVar4->strType,"2D");
  }
  file_local._7_1_ = !bVar5;
  return file_local._7_1_;
}

Assistant:

bool Read2D(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt{ RegularFormat::_2D };

    if (!IsFileExt(file.name(), "2d") || file.size() != fmt.disk_size())
        return false;

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "2D";

    return true;
}